

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_header.hpp
# Opt level: O1

void __thiscall
ELFIO::elf_header_impl<ELFIO::Elf64_Ehdr>::~elf_header_impl
          (elf_header_impl<ELFIO::Elf64_Ehdr> *this)

{
  operator_delete(this);
  return;
}

Assistant:

elf_header_impl( endianess_convertor convertor_,
                     unsigned char encoding ) : convertor(convertor_)
    {
        std::fill_n( reinterpret_cast<char*>( &header ), sizeof( header ), '\0' );

        header.e_ident[EI_MAG0]    = ELFMAG0;
        header.e_ident[EI_MAG1]    = ELFMAG1;
        header.e_ident[EI_MAG2]    = ELFMAG2;
        header.e_ident[EI_MAG3]    = ELFMAG3;
        header.e_ident[EI_CLASS]   = elf_header_impl_types<T>::file_class;
        header.e_ident[EI_DATA]    = encoding;
        header.e_ident[EI_VERSION] = EV_CURRENT;
        header.e_version           = EV_CURRENT;
        header.e_version           = convertor( header.e_version );
        header.e_ehsize            = ( sizeof( header ) );
        header.e_ehsize            = convertor( header.e_ehsize );
        header.e_shstrndx          = convertor( (Elf_Half)1 );
        header.e_phentsize         = sizeof( typename elf_header_impl_types<T>::Phdr_type );
        header.e_shentsize         = sizeof( typename elf_header_impl_types<T>::Shdr_type );
        header.e_phentsize         = convertor( header.e_phentsize );
        header.e_shentsize         = convertor( header.e_shentsize );
    }